

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
HasNoNewUnconfirmed_abi_cxx11_(CTransaction *tx,CTxMemPool *pool,setEntries *iters_conflicting)

{
  long lVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  uint256 *args_1;
  size_type sVar4;
  CTxMemPool *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<uint256>,_bool> pVar5;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range2;
  hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
  *mi;
  setEntries *__range1;
  uint j;
  const_iterator __end2;
  const_iterator __begin2;
  iterator __end1;
  iterator __begin1;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> parents_of_conflicts;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  CTxMemPoolEntry *in_stack_fffffffffffffeb8;
  CTxMemPool *this;
  uint local_d4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
             (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
             (AnnotatedMixin<std::recursive_mutex> *)0x124fb1d);
  _GLOBAL__N_1::std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::set
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::
  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  ::begin(in_stack_fffffffffffffe60);
  std::
  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  ::end(in_stack_fffffffffffffe60);
  while (bVar2 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffe6f,
                                                   in_stack_fffffffffffffe68),
                                 (_Self *)in_stack_fffffffffffffe60), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::
    _Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
    ::operator*((_Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    in_stack_fffffffffffffeb8 =
         boost::operators_impl::
         dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
         ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                       *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    CTxMemPoolEntry::GetTx
              ((CTxMemPoolEntry *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffe60);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::end
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffe60);
    while (bVar2 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                              (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)in_stack_fffffffffffffe60), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<false> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      pVar5 = _GLOBAL__N_1::std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::insert
                        ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                         CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                         (value_type *)in_stack_fffffffffffffe60);
      in_stack_fffffffffffffe9f = pVar5.second;
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
    std::
    _Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
    ::operator++((_Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  }
  local_d4 = 0;
  do {
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)local_d4;
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                        CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    if (pbVar3 <= args) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this);
LAB_0124fe7a:
      std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::~set
                ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI;
    }
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
               (size_type)in_stack_fffffffffffffe60);
    args_1 = transaction_identifier::operator_cast_to_uint256_
                       ((transaction_identifier<false> *)
                        CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    sVar4 = std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::count
                      ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                       CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                       (key_type *)in_stack_fffffffffffffe60);
    if (sVar4 == 0) {
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                 CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                 (size_type)in_stack_fffffffffffffe60);
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<false> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      GenTxid::Txid((uint256 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      in_stack_fffffffffffffe6f = CTxMemPool::exists(this,(GenTxid *)in_stack_fffffffffffffeb8);
      if ((bool)in_stack_fffffffffffffe6f) {
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CTransaction::GetHash
                           ((CTransaction *)
                            CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        transaction_identifier<false>::ToString_abi_cxx11_((transaction_identifier<false> *)pbVar3);
        tinyformat::format<std::__cxx11::string,unsigned_int>
                  ((char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),args,
                   (uint *)args_1);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),pbVar3);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        goto LAB_0124fe7a;
      }
    }
    local_d4 = local_d4 + 1;
  } while( true );
}

Assistant:

std::optional<std::string> HasNoNewUnconfirmed(const CTransaction& tx,
                                               const CTxMemPool& pool,
                                               const CTxMemPool::setEntries& iters_conflicting)
{
    AssertLockHeld(pool.cs);
    std::set<uint256> parents_of_conflicts;
    for (const auto& mi : iters_conflicting) {
        for (const CTxIn& txin : mi->GetTx().vin) {
            parents_of_conflicts.insert(txin.prevout.hash);
        }
    }

    for (unsigned int j = 0; j < tx.vin.size(); j++) {
        // Rule #2: We don't want to accept replacements that require low feerate junk to be
        // mined first.  Ideally we'd keep track of the ancestor feerates and make the decision
        // based on that, but for now requiring all new inputs to be confirmed works.
        //
        // Note that if you relax this to make RBF a little more useful, this may break the
        // CalculateMempoolAncestors RBF relaxation which subtracts the conflict count/size from the
        // descendant limit.
        if (!parents_of_conflicts.count(tx.vin[j].prevout.hash)) {
            // Rather than check the UTXO set - potentially expensive - it's cheaper to just check
            // if the new input refers to a tx that's in the mempool.
            if (pool.exists(GenTxid::Txid(tx.vin[j].prevout.hash))) {
                return strprintf("replacement %s adds unconfirmed input, idx %d",
                                 tx.GetHash().ToString(), j);
            }
        }
    }
    return std::nullopt;
}